

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderIndexBuffer::prepare
          (RenderIndexBuffer *this,PrepareRenderPassContext *context)

{
  Context *pCVar1;
  DeviceInterface *deviceInterface;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  RenderIndexBuffer *pRVar3;
  const_iterator cVar4;
  key_type local_c8;
  Move<vk::Handle<(vk::HandleType)14>_> local_a8;
  key_type local_88;
  RenderIndexBuffer *local_68;
  VkRenderPass local_60;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  
  local_60.m_internal = (context->m_renderPass).m_internal;
  pCVar1 = context->m_context->m_context;
  deviceInterface = pCVar1->m_vkd;
  device = pCVar1->m_device;
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar1->m_binaryCollection;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"index-buffer.vert","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,&local_c8);
  ::vk::createShaderModule
            (&local_a8,deviceInterface,device,*(ProgramBinary **)(cVar4._M_node + 2),0);
  DStack_50.m_device =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_50.m_allocator =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_58.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_50.m_deviceIface =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_68 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"render-white.frag","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,&local_88);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_c8,deviceInterface,device,
             *(ProgramBinary **)(cVar4._M_node + 2),0);
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)local_c8.field_2._M_allocated_capacity;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_c8.field_2._8_8_;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       (deUint64)local_c8._M_dataplus._M_p;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_c8._M_string_length;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_c8.field_2._8_8_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pRVar3 = local_68;
  local_c8.field_2._M_allocated_capacity = 0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  createPipelineWithResources
            (deviceInterface,device,local_60,(deUint32)&local_58,(VkShaderModule *)&local_a8,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)&local_c8,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&local_88,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)0x0,(vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)0x0,
             &local_68->m_resources);
  pRVar3->m_bufferSize = context->m_context->m_currentBufferSize;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  return;
}

Assistant:

void RenderIndexBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&				vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice						device					= context.getContext().getDevice();
	const vk::VkRenderPass					renderPass				= context.getRenderPass();
	const deUint32							subpass					= 0;
	const vk::Unique<vk::VkShaderModule>	vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("index-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>	fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), vector<vk::VkDescriptorSetLayoutBinding>(), vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);
	m_bufferSize = context.getBufferSize();
}